

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_compressionParameters *
ZSTD_adjustCParams_internal
          (ZSTD_compressionParameters cPar,unsigned_long_long srcSize,size_t dictSize)

{
  uint uVar1;
  U32 UVar2;
  ulong in_RDX;
  ulong in_RSI;
  ZSTD_compressionParameters *in_RDI;
  uint in_stack_00000008;
  U32 in_stack_0000000c;
  uint in_stack_00000010;
  undefined4 in_stack_00000014;
  undefined4 uStack0000000000000018;
  undefined4 uStack000000000000001c;
  ZSTD_strategy in_stack_00000020;
  U32 cycleLog;
  U32 srcLog;
  U32 tSize;
  uint local_3c;
  ulong local_8;
  
  if ((in_RDX == 0) || (1 < in_RSI + 1)) {
    local_8 = in_RSI;
    if (in_RSI == 0) {
      local_8 = 0xffffffffffffffff;
    }
  }
  else {
    local_8 = 0x201;
  }
  if ((local_8 < 0x40000000) && (in_RDX < 0x40000000)) {
    uVar1 = (int)local_8 + (int)in_RDX;
    if (uVar1 < 0x40) {
      local_3c = 6;
    }
    else {
      UVar2 = ZSTD_highbit32(uVar1 - 1);
      local_3c = UVar2 + 1;
    }
    if (local_3c < in_stack_00000008) {
      in_stack_00000008 = local_3c;
    }
  }
  if (in_stack_00000008 < in_stack_00000010) {
    in_stack_00000010 = in_stack_00000008;
  }
  UVar2 = ZSTD_cycleLog(in_stack_0000000c,in_stack_00000020);
  if (in_stack_00000008 < UVar2) {
    in_stack_0000000c = in_stack_0000000c - (UVar2 - in_stack_00000008);
  }
  if (in_stack_00000008 < 10) {
    in_stack_00000008 = 10;
  }
  in_RDI->windowLog = in_stack_00000008;
  in_RDI->chainLog = in_stack_0000000c;
  in_RDI->hashLog = in_stack_00000010;
  in_RDI->searchLog = in_stack_00000014;
  in_RDI->searchLength = uStack0000000000000018;
  in_RDI->targetLength = uStack000000000000001c;
  in_RDI->strategy = in_stack_00000020;
  return in_RDI;
}

Assistant:

ZSTD_compressionParameters ZSTD_adjustCParams_internal(ZSTD_compressionParameters cPar, unsigned long long srcSize, size_t dictSize)
{
    static const U64 minSrcSize = 513; /* (1<<9) + 1 */
    static const U64 maxWindowResize = 1ULL << (ZSTD_WINDOWLOG_MAX-1);
    assert(ZSTD_checkCParams(cPar)==0);

    if (dictSize && (srcSize+1<2) /* srcSize unknown */ )
        srcSize = minSrcSize;  /* presumed small when there is a dictionary */
    else if (srcSize == 0)
        srcSize = ZSTD_CONTENTSIZE_UNKNOWN;  /* 0 == unknown : presumed large */

    /* resize windowLog if input is small enough, to use less memory */
    if ( (srcSize < maxWindowResize)
      && (dictSize < maxWindowResize) )  {
        U32 const tSize = (U32)(srcSize + dictSize);
        static U32 const hashSizeMin = 1 << ZSTD_HASHLOG_MIN;
        U32 const srcLog = (tSize < hashSizeMin) ? ZSTD_HASHLOG_MIN :
                            ZSTD_highbit32(tSize-1) + 1;
        if (cPar.windowLog > srcLog) cPar.windowLog = srcLog;
    }
    if (cPar.hashLog > cPar.windowLog) cPar.hashLog = cPar.windowLog;
    {   U32 const cycleLog = ZSTD_cycleLog(cPar.chainLog, cPar.strategy);
        if (cycleLog > cPar.windowLog)
            cPar.chainLog -= (cycleLog - cPar.windowLog);
    }

    if (cPar.windowLog < ZSTD_WINDOWLOG_ABSOLUTEMIN)
        cPar.windowLog = ZSTD_WINDOWLOG_ABSOLUTEMIN;  /* required for frame header */

    return cPar;
}